

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave-light.c
# Opt level: O2

void borg_update_light(void)

{
  ushort *puVar1;
  byte *pbVar2;
  ushort uVar3;
  borg_grid *pbVar4;
  borg_grid *pbVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  _Bool _Var9;
  long lVar10;
  ulong uVar11;
  uint8_t uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint8_t uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  wchar_t wVar20;
  long lVar21;
  uint8_t uVar22;
  int iVar23;
  uint uVar24;
  uint8_t uVar25;
  int dy;
  uint uVar26;
  uint8_t uVar27;
  ulong uVar28;
  uint uVar29;
  
  for (lVar10 = 0; iVar8 = borg.c.y, iVar7 = borg.c.x, lVar10 < borg_light_n; lVar10 = lVar10 + 1) {
    borg_grids[borg_light_y[lVar10]][borg_light_x[lVar10]].info =
         borg_grids[borg_light_y[lVar10]][borg_light_x[lVar10]].info & 0xffef;
  }
  borg_light_n = 0;
  if (borg_items[(ulong)z_info->pack_size + 5].iqty != '\0') {
    lVar21 = (long)borg.c.y;
    pbVar4 = borg_grids[lVar21];
    lVar18 = (long)borg.c.x;
    lVar10 = lVar18 * 0xc;
    pbVar4[lVar18].info = pbVar4[lVar18].info | 0x10;
    uVar12 = (uint8_t)iVar8;
    borg_light_y[borg_light_n] = uVar12;
    uVar27 = (uint8_t)iVar7;
    borg_light_x[borg_light_n] = uVar27;
    piVar6 = borg.trait;
    borg_light_n = borg_light_n + 1;
    if (0 < borg.trait[0x1a]) {
      pbVar5 = borg_grids[lVar21 + 1];
      pbVar5[lVar18].info = pbVar5[lVar18].info | 0x10;
      uVar25 = uVar12 + '\x01';
      borg_light_y[borg_light_n] = uVar25;
      borg_light_x[borg_light_n] = uVar27;
      borg_light_n = borg_light_n + 1;
      lVar21 = *(long *)(&DAT_002f9138 + lVar21 * 8);
      puVar1 = (ushort *)(lVar21 + 2 + lVar10);
      *puVar1 = *puVar1 | 0x10;
      uVar22 = uVar12 + 0xff;
      borg_light_y[borg_light_n] = uVar22;
      borg_light_x[borg_light_n] = uVar27;
      borg_light_n = borg_light_n + 1;
      *(byte *)&pbVar4[lVar18 + 1].info = (byte)pbVar4[lVar18 + 1].info | 0x10;
      borg_light_y[borg_light_n] = uVar12;
      uVar16 = uVar27 + '\x01';
      borg_light_x[borg_light_n] = uVar16;
      borg_light_n = borg_light_n + 1;
      *(byte *)&pbVar4[lVar18 + -1].info = (byte)pbVar4[lVar18 + -1].info | 0x10;
      borg_light_y[borg_light_n] = uVar12;
      uVar27 = uVar27 + 0xff;
      borg_light_x[borg_light_n] = uVar27;
      borg_light_n = borg_light_n + 1;
      *(byte *)&pbVar5[lVar18 + 1].info = (byte)pbVar5[lVar18 + 1].info | 0x10;
      borg_light_y[borg_light_n] = uVar25;
      borg_light_x[borg_light_n] = uVar16;
      borg_light_n = borg_light_n + 1;
      *(byte *)&pbVar5[lVar18 + -1].info = (byte)pbVar5[lVar18 + -1].info | 0x10;
      borg_light_y[borg_light_n] = uVar25;
      borg_light_x[borg_light_n] = uVar27;
      borg_light_n = borg_light_n + 1;
      pbVar2 = (byte *)(lVar21 + 0xe + lVar10);
      *pbVar2 = *pbVar2 | 0x10;
      borg_light_y[borg_light_n] = uVar22;
      borg_light_x[borg_light_n] = uVar16;
      borg_light_n = borg_light_n + 1;
      pbVar2 = (byte *)(lVar21 + -10 + lVar10);
      *pbVar2 = *pbVar2 | 0x10;
      borg_light_y[borg_light_n] = uVar22;
      borg_light_x[borg_light_n] = uVar27;
      borg_light_n = borg_light_n + 1;
      if ((1 < piVar6[0x1a]) && (iVar7 - 3U < 0xc1 && iVar8 - 3U < 0x3d)) {
        _Var9 = borg_cave_floor_bold(iVar8 + L'\x02',iVar7);
        iVar8 = borg.c.y;
        iVar7 = borg.c.x;
        lVar10 = (long)borg.c.x;
        if (_Var9) {
          pbVar4 = borg_grids[(long)borg.c.y + 2];
          pbVar4[lVar10].info = pbVar4[lVar10].info | 0x10;
          uVar27 = (char)iVar8 + '\x02';
          borg_light_y[borg_light_n] = uVar27;
          uVar12 = (uint8_t)iVar7;
          borg_light_x[borg_light_n] = uVar12;
          borg_light_n = borg_light_n + 1;
          *(byte *)&pbVar4[lVar10 + 2].info = (byte)pbVar4[lVar10 + 2].info | 0x10;
          borg_light_y[borg_light_n] = uVar27;
          borg_light_x[borg_light_n] = uVar12 + '\x02';
          borg_light_n = borg_light_n + 1;
          *(byte *)&pbVar4[lVar10 + -2].info = (byte)pbVar4[lVar10 + -2].info | 0x10;
          borg_light_y[borg_light_n] = uVar27;
          borg_light_x[borg_light_n] = uVar12 + 0xfe;
          borg_light_n = borg_light_n + 1;
        }
        _Var9 = borg_cave_floor_bold(iVar8 + L'\xfffffffe',iVar7);
        iVar8 = borg.c.y;
        iVar7 = borg.c.x;
        if (_Var9) {
          lVar10 = *(long *)(borg_view_x + (long)borg.c.y * 8 + 0x2320);
          lVar18 = (long)borg.c.x * 0xc;
          puVar1 = (ushort *)(lVar10 + 2 + lVar18);
          *puVar1 = *puVar1 | 0x10;
          uVar27 = (char)iVar8 + 0xfe;
          borg_light_y[borg_light_n] = uVar27;
          uVar12 = (uint8_t)iVar7;
          borg_light_x[borg_light_n] = uVar12;
          borg_light_n = borg_light_n + 1;
          pbVar2 = (byte *)(lVar10 + 0x1a + lVar18);
          *pbVar2 = *pbVar2 | 0x10;
          borg_light_y[borg_light_n] = uVar27;
          borg_light_x[borg_light_n] = uVar12 + '\x02';
          borg_light_n = borg_light_n + 1;
          pbVar2 = (byte *)(lVar10 + -0x16 + lVar18);
          *pbVar2 = *pbVar2 | 0x10;
          borg_light_y[borg_light_n] = uVar27;
          borg_light_x[borg_light_n] = uVar12 + 0xfe;
          borg_light_n = borg_light_n + 1;
        }
        _Var9 = borg_cave_floor_bold(iVar8,iVar7 + L'\x02');
        iVar8 = borg.c.y;
        iVar7 = borg.c.x;
        lVar18 = (long)borg.c.y;
        lVar10 = (long)borg.c.x;
        if (_Var9) {
          borg_grids[lVar18][lVar10 + 2].info = borg_grids[lVar18][lVar10 + 2].info | 0x10;
          uVar12 = (uint8_t)iVar8;
          borg_light_y[borg_light_n] = uVar12;
          uVar27 = (char)iVar7 + '\x02';
          borg_light_x[borg_light_n] = uVar27;
          borg_light_n = borg_light_n + 1;
          borg_grids[lVar18 + 1][lVar10 + 2].info = borg_grids[lVar18 + 1][lVar10 + 2].info | 0x10;
          borg_light_y[borg_light_n] = uVar12 + '\x01';
          borg_light_x[borg_light_n] = uVar27;
          borg_light_n = borg_light_n + 1;
          puVar1 = (ushort *)(*(long *)(&DAT_002f9138 + lVar18 * 8) + 0x1a + lVar10 * 0xc);
          *puVar1 = *puVar1 | 0x10;
          borg_light_y[borg_light_n] = uVar12 + 0xff;
          borg_light_x[borg_light_n] = uVar27;
          borg_light_n = borg_light_n + 1;
        }
        _Var9 = borg_cave_floor_bold(iVar8,iVar7 + L'\xfffffffe');
        iVar8 = borg.c.y;
        iVar7 = borg.c.x;
        if (_Var9) {
          lVar18 = (long)borg.c.y;
          lVar10 = (long)borg.c.x;
          borg_grids[lVar18][lVar10 + -2].info = borg_grids[lVar18][lVar10 + -2].info | 0x10;
          uVar12 = (uint8_t)iVar8;
          borg_light_y[borg_light_n] = uVar12;
          uVar27 = (char)iVar7 + 0xfe;
          borg_light_x[borg_light_n] = uVar27;
          borg_light_n = borg_light_n + 1;
          borg_grids[lVar18 + 2][lVar10 + -2].info = borg_grids[lVar18 + 2][lVar10 + -2].info | 0x10
          ;
          borg_light_y[borg_light_n] = uVar12 + '\x02';
          borg_light_x[borg_light_n] = uVar27;
          borg_light_n = borg_light_n + 1;
          puVar1 = (ushort *)(*(long *)(borg_view_x + lVar18 * 8 + 0x2320) + -0x16 + lVar10 * 0xc);
          *puVar1 = *puVar1 | 0x10;
          borg_light_y[borg_light_n] = uVar12 + 0xfe;
          borg_light_x[borg_light_n] = uVar27;
          borg_light_n = borg_light_n + 1;
        }
      }
    }
    uVar26 = borg.trait[0x1a];
    if (((2 < (int)uVar26) && (borg.c.y - 4U < 0x3b)) && (borg.c.x - 4U < 0xbf)) {
      uVar29 = 5;
      if (uVar26 < 5) {
        uVar29 = uVar26;
      }
      _Var9 = borg_cave_floor_bold(borg.c.y + L'\x03',borg.c.x + L'\x03');
      iVar8 = borg.c.y;
      iVar7 = borg.c.x;
      wVar20 = borg.c.y + L'\x03';
      if (_Var9) {
        borg_grids[(long)borg.c.y + 3][(long)borg.c.x + 3].info =
             borg_grids[(long)borg.c.y + 3][(long)borg.c.x + 3].info | 0x10;
        borg_light_y[borg_light_n] = (char)iVar8 + '\x03';
        borg_light_x[borg_light_n] = (char)iVar7 + '\x03';
        borg_light_n = borg_light_n + 1;
      }
      _Var9 = borg_cave_floor_bold(wVar20,iVar7 + L'\xfffffffd');
      iVar8 = borg.c.y;
      iVar7 = borg.c.x;
      if (_Var9) {
        borg_grids[(long)borg.c.y + 3][(long)borg.c.x + -3].info =
             borg_grids[(long)borg.c.y + 3][(long)borg.c.x + -3].info | 0x10;
        borg_light_y[borg_light_n] = (char)iVar8 + '\x03';
        borg_light_x[borg_light_n] = (char)iVar7 + 0xfd;
        borg_light_n = borg_light_n + 1;
      }
      _Var9 = borg_cave_floor_bold(iVar8 + L'\xfffffffd',iVar7 + L'\x03');
      iVar8 = borg.c.y;
      iVar7 = borg.c.x;
      wVar20 = borg.c.y + L'\xfffffffd';
      if (_Var9) {
        puVar1 = (ushort *)
                 (*(long *)(borg_view_x + (long)borg.c.y * 8 + 0x2318) + 0x26 + (long)borg.c.x * 0xc
                 );
        *puVar1 = *puVar1 | 0x10;
        borg_light_y[borg_light_n] = (char)iVar8 + 0xfd;
        borg_light_x[borg_light_n] = (char)iVar7 + '\x03';
        borg_light_n = borg_light_n + 1;
      }
      _Var9 = borg_cave_floor_bold(wVar20,iVar7 + L'\xfffffffd');
      iVar8 = borg.c.y;
      iVar7 = borg.c.x;
      if (_Var9) {
        puVar1 = (ushort *)
                 (*(long *)(borg_view_x + (long)borg.c.y * 8 + 0x2318) + -0x22 +
                 (long)borg.c.x * 0xc);
        *puVar1 = *puVar1 | 0x10;
        borg_light_y[borg_light_n] = (char)iVar8 + 0xfd;
        borg_light_x[borg_light_n] = (char)iVar7 + 0xfd;
        borg_light_n = borg_light_n + 1;
      }
      uVar11 = (ulong)(iVar8 - uVar29);
      if ((int)(iVar8 - uVar29) < 1) {
        uVar11 = 0;
      }
      iVar23 = 0x41;
      if ((int)(iVar8 + uVar29) < 0x41) {
        iVar23 = iVar8 + uVar29;
      }
      uVar13 = (ulong)(iVar7 - uVar29);
      if ((int)(iVar7 - uVar29) < 1) {
        uVar13 = 0;
      }
      iVar17 = 0xc5;
      if ((int)(iVar7 + uVar29) < 0xc5) {
        iVar17 = iVar7 + uVar29;
      }
      for (; (long)uVar11 <= (long)iVar23; uVar11 = uVar11 + 1) {
        uVar14 = iVar8 - (int)uVar11;
        uVar26 = -uVar14;
        if (0 < (int)uVar14) {
          uVar26 = uVar14;
        }
        uVar28 = uVar13 * 0xc | 2;
        uVar14 = iVar7 - (int)uVar13;
        for (uVar19 = uVar13; (long)uVar19 <= (long)iVar17; uVar19 = uVar19 + 1) {
          uVar15 = -uVar14;
          if (0 < (int)uVar14) {
            uVar15 = uVar14;
          }
          if ((2 < uVar26) || (2 < uVar15)) {
            uVar24 = uVar15 + (uVar26 >> 1);
            if (uVar15 < uVar26) {
              uVar24 = (uVar15 >> 1) + uVar26;
            }
            if (uVar24 <= uVar29) {
              uVar3 = *(ushort *)(&borg_grids[uVar11]->feat + uVar28);
              if ((uVar3 & 0x20) != 0) {
                *(ushort *)(&borg_grids[uVar11]->feat + uVar28) = uVar3 | 0x10;
                borg_light_y[borg_light_n] = (uint8_t)uVar11;
                borg_light_x[borg_light_n] = (uint8_t)uVar19;
                borg_light_n = borg_light_n + 1;
              }
            }
          }
          uVar28 = uVar28 + 0xc;
          uVar14 = uVar14 - 1;
        }
      }
    }
  }
  return;
}

Assistant:

void borg_update_light(void)
{
    int i, x, y, min_x, max_x, min_y, max_y;

    /*** Clear old grids ***/

    /* Clear them all */
    for (i = 0; i < borg_light_n; i++) {
        y = borg_light_y[i];
        x = borg_light_x[i];

        /* Mark the grid as not "lite" */
        borg_grids[y][x].info &= ~BORG_LIGHT;
    }

    /* None left */
    borg_light_n = 0;

    /* Hack -- Player has no lite */
    if (borg_items[INVEN_LIGHT].iqty <= 0)
        return;

    /*** Collect the new "lite" grids ***/

    /* Player grid */
    borg_cave_light_hack(borg.c.y, borg.c.x);

    /* Radius 1 -- torch radius */
    if (borg.trait[BI_LIGHT] >= 1) {
        /* Adjacent grid */
        borg_cave_light_hack(borg.c.y + 1, borg.c.x);
        borg_cave_light_hack(borg.c.y - 1, borg.c.x);
        borg_cave_light_hack(borg.c.y, borg.c.x + 1);
        borg_cave_light_hack(borg.c.y, borg.c.x - 1);

        /* Diagonal grids */
        borg_cave_light_hack(borg.c.y + 1, borg.c.x + 1);
        borg_cave_light_hack(borg.c.y + 1, borg.c.x - 1);
        borg_cave_light_hack(borg.c.y - 1, borg.c.x + 1);
        borg_cave_light_hack(borg.c.y - 1, borg.c.x - 1);
    }

    /* Radius 2 -- lantern radius */
    if (borg.trait[BI_LIGHT] >= 2 && borg.c.y + 2 < AUTO_MAX_Y
        && borg.c.y - 2 > 0 && borg.c.x + 2 < AUTO_MAX_X && borg.c.x - 2 > 0) {
        /* South of the player */
        if (borg_cave_floor_bold(borg.c.y + 2, borg.c.x)) {
            borg_cave_light_hack(borg.c.y + 2, borg.c.x);
            borg_cave_light_hack(borg.c.y + 2, borg.c.x + 2);
            borg_cave_light_hack(borg.c.y + 2, borg.c.x - 2);
        }

        /* North of the player */
        if (borg_cave_floor_bold(borg.c.y - 2, borg.c.x)) {
            borg_cave_light_hack(borg.c.y - 2, borg.c.x);
            borg_cave_light_hack(borg.c.y - 2, borg.c.x + 2);
            borg_cave_light_hack(borg.c.y - 2, borg.c.x - 2);
        }

        /* East of the player */
        if (borg_cave_floor_bold(borg.c.y, borg.c.x + 2)) {
            borg_cave_light_hack(borg.c.y, borg.c.x + 2);
            borg_cave_light_hack(borg.c.y + 1, borg.c.x + 2);
            borg_cave_light_hack(borg.c.y - 1, borg.c.x + 2);
        }

        /* West of the player */
        if (borg_cave_floor_bold(borg.c.y, borg.c.x - 2)) {
            borg_cave_light_hack(borg.c.y, borg.c.x - 2);
            borg_cave_light_hack(borg.c.y + 2, borg.c.x - 2);
            borg_cave_light_hack(borg.c.y - 2, borg.c.x - 2);
        }
    }

    /* Radius 3+ -- artifact radius */
    if (borg.trait[BI_LIGHT] >= 3 && borg.c.y + 3 < AUTO_MAX_Y
        && borg.c.y - 3 > 0 && borg.c.x + 3 < AUTO_MAX_X && borg.c.x - 3 > 0) {
        int d, p;

        /* Maximal radius */
        p = borg.trait[BI_LIGHT];

        /* Paranoia -- see "LITE_MAX" */
        if (p > 5)
            p = 5;

        /* South-East of the player */
        if (borg_cave_floor_bold(borg.c.y + 3, borg.c.x + 3)) {
            borg_cave_light_hack(borg.c.y + 3, borg.c.x + 3);
        }

        /* South-West of the player */
        if (borg_cave_floor_bold(borg.c.y + 3, borg.c.x - 3)) {
            borg_cave_light_hack(borg.c.y + 3, borg.c.x - 3);
        }

        /* North-East of the player */
        if (borg_cave_floor_bold(borg.c.y - 3, borg.c.x + 3)) {
            borg_cave_light_hack(borg.c.y - 3, borg.c.x + 3);
        }

        /* North-West of the player */
        if (borg_cave_floor_bold(borg.c.y - 3, borg.c.x - 3)) {
            borg_cave_light_hack(borg.c.y - 3, borg.c.x - 3);
        }

        /* Maximal north */
        min_y = borg.c.y - p;
        if (min_y < 0)
            min_y = 0;

        /* Maximal south */
        max_y = borg.c.y + p;
        if (max_y > AUTO_MAX_Y - 1)
            max_y = AUTO_MAX_Y - 1;

        /* Maximal west */
        min_x = borg.c.x - p;
        if (min_x < 0)
            min_x = 0;

        /* Maximal east */
        max_x = borg.c.x + p;
        if (max_x > AUTO_MAX_X - 1)
            max_x = AUTO_MAX_X - 1;

        /* Scan the maximal box */
        for (y = min_y; y <= max_y; y++) {
            for (x = min_x; x <= max_x; x++) {
                int dy = (borg.c.y > y) ? (borg.c.y - y) : (y - borg.c.y);
                int dx = (borg.c.x > x) ? (borg.c.x - x) : (x - borg.c.x);

                /* Skip the "central" grids (above) */
                if ((dy <= 2) && (dx <= 2))
                    continue;

                /* Hack -- approximate the distance */
                d = (dy > dx) ? (dy + (dx >> 1)) : (dx + (dy >> 1));

                /* Skip distant grids */
                if (d > p)
                    continue;

                /* Viewable, nearby, grids get "torch lit" */
                if (borg_grids[y][x].info & BORG_VIEW) {
                    /* This grid is "torch lit" */
                    borg_cave_light_hack(y, x);
                }
            }
        }
    }
}